

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsgridlayout.cpp
# Opt level: O0

void __thiscall QGraphicsGridLayout::setGeometry(QGraphicsGridLayout *this,QRectF *rect)

{
  LayoutDirection LVar1;
  QGraphicsGridLayoutPrivate *pQVar2;
  QGraphicsGridLayoutPrivate *in_RDI;
  long in_FS_OFFSET;
  LayoutDirection visualDir;
  QGraphicsGridLayoutPrivate *d;
  qreal bottom;
  qreal right;
  qreal top;
  qreal left;
  QRectF effectiveRect;
  double *in_stack_ffffffffffffff78;
  double *in_stack_ffffffffffffff80;
  QGraphicsGridLayoutEngine *pQVar3;
  QGraphicsLayoutPrivate *in_stack_ffffffffffffff88;
  QRectF *this_00;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  qreal local_48;
  qreal local_40;
  qreal local_38;
  qreal local_30;
  QRectF local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QGraphicsGridLayout *)0x96e635);
  QGraphicsLayoutItem::setGeometry
            ((QGraphicsLayoutItem *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (QRectF *)in_RDI);
  local_28.xp = -NAN;
  local_28.yp = -NAN;
  local_28.w = -NAN;
  local_28.h = -NAN;
  QGraphicsLayoutItem::geometry((QGraphicsLayoutItem *)in_RDI);
  local_30 = -NAN;
  local_38 = -NAN;
  local_40 = -NAN;
  local_48 = -NAN;
  (*(in_RDI->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate.
    _vptr_QGraphicsLayoutItemPrivate[3])(in_RDI,&local_30,&local_38,&local_40,&local_48);
  LVar1 = QGraphicsLayoutPrivate::visualDirection(in_stack_ffffffffffffff88);
  QGridLayoutEngine::setVisualDirection((int)pQVar2 + 0x118);
  if (LVar1 == RightToLeft) {
    qSwap<double>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  this_00 = &local_28;
  QRectF::adjust(this_00,local_30,local_38,-local_40,-local_48);
  pQVar3 = &pQVar2->engine;
  QGraphicsGridLayoutPrivate::styleInfo(in_RDI);
  QGridLayoutEngine::setGeometries((QRectF *)pQVar3,(QAbstractLayoutStyleInfo *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsGridLayout::setGeometry(const QRectF &rect)
{
    Q_D(QGraphicsGridLayout);
    QGraphicsLayout::setGeometry(rect);
    QRectF effectiveRect = geometry();
    qreal left, top, right, bottom;
    getContentsMargins(&left, &top, &right, &bottom);
    Qt::LayoutDirection visualDir = d->visualDirection();
    d->engine.setVisualDirection(visualDir);
    if (visualDir == Qt::RightToLeft)
        qSwap(left, right);
    effectiveRect.adjust(+left, +top, -right, -bottom);
    d->engine.setGeometries(effectiveRect, d->styleInfo());
#ifdef QGRIDLAYOUTENGINE_DEBUG
    if (qt_graphicsLayoutDebug()) {
        static int counter = 0;
        qDebug("==== BEGIN DUMP OF QGraphicsGridLayout (%d)====", counter++);
        d->dump(1);
        qDebug("==== END DUMP OF QGraphicsGridLayout ====");
    }
#endif
}